

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue_generic_tests.h
# Opt level: O2

bool density_tests::detail::
     PutTestObject<density::lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)0>,_2048UL,_2048UL>
     ::put(conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
           *queue,EasyRandom *i_rand)

{
  int32_t iVar1;
  ulong uVar2;
  runtime_type<> type;
  ElementType source;
  
  uVar2 = (ulong)&stack0xffffffffffffffe0 & 0xfffffffffffff800;
  *(undefined8 *)(uVar2 - 0x1808) = 0x109ab70;
  iVar1 = EasyRandom::get_bool(i_rand,0.9);
  if (iVar1 == 0) {
    ((runtime_type *)(uVar2 - 0x1008))->m_feature_table =
         (tuple_type *)
         density::detail::
         FeatureTable<std::tuple<density::f_size,density::f_alignment,density::f_copy_construct,density::f_move_construct,density::f_rtti,density::f_destroy>,density_tests::TestObject<2048ul,2048ul>>
         ::s_table;
    *(undefined8 *)(uVar2 - 0x1808) = 0x109abb3;
    TestObject<2048UL,_2048UL>::TestObject((TestObject<2048UL,_2048UL> *)(uVar2 - 0x1000));
    *(undefined8 *)(uVar2 - 0x1808) = 0x109abc1;
    density::
    lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)0>
    ::dyn_push_copy((lf_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)0,_(density::consistency_model)0>
                     *)queue,(runtime_type *)(uVar2 - 0x1008),
                    (TestObject<2048UL,_2048UL> *)(uVar2 - 0x1000));
  }
  else {
    *(undefined8 *)(uVar2 - 0x1808) = 0x109ab84;
    TestObject<2048UL,_2048UL>::TestObject((TestObject<2048UL,_2048UL> *)(uVar2 - 0x1000));
    *(undefined8 *)(uVar2 - 0x1808) = 0x109ab8f;
    density::
    lf_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)0>
    ::emplace<density_tests::TestObject<2048ul,2048ul>,density_tests::TestObject<2048ul,2048ul>>
              ((lf_heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)0,(density::consistency_model)0>
                *)queue,(TestObject<2048UL,_2048UL> *)(uVar2 - 0x1000));
  }
  *(undefined8 *)(uVar2 - 0x1808) = 0x109abce;
  TestObject<2048UL,_2048UL>::~TestObject((TestObject<2048UL,_2048UL> *)(uVar2 - 0x1000));
  return true;
}

Assistant:

static bool put(QUEUE & queue, EasyRandom & i_rand)
            {
                if (i_rand.get_bool(.9))
                {
                    queue.push(ElementType());
                }
                else
                {
                    auto        type = QUEUE::runtime_type::template make<ElementType>();
                    ElementType source;
                    queue.dyn_push_copy(type, &source);
                }
                return true;
            }